

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void Predict(string *test_file,string *predict_file)

{
  int __fd;
  clock_t cVar1;
  char *__file;
  size_type sVar2;
  clock_t cVar3;
  clock_t end_time;
  reference_wrapper<std::vector<char,_std::allocator<char>_>_> rStack_90;
  int i_1;
  int local_88;
  int local_84;
  undefined1 local_80 [4];
  int i;
  vector<std::thread,_std::allocator<std::thread>_> thread_vec;
  int cnt_per_thread;
  int thread_num;
  allocator_type local_4a;
  value_type_conflict2 local_49;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> res;
  char *buf;
  int fd;
  clock_t start_time;
  string *predict_file_local;
  string *test_file_local;
  
  cVar1 = clock();
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0);
  res.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
       mmap((void *)0x0,120000000,1,2,__fd,0);
  madvise((void *)res.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,120000000,2);
  close(__fd);
  local_49 = '1';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_48,20000,&local_49,&local_4a);
  std::allocator<char>::~allocator(&local_4a);
  thread_vec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x9c4;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_80);
  for (local_84 = 0; local_84 < 8; local_84 = local_84 + 1) {
    local_88 = local_84 *
               thread_vec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
    rStack_90 = std::ref<std::vector<char,std::allocator<char>>>
                          ((vector<char,_std::allocator<char>_> *)local_48);
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(char*,int,int,std::vector<char,std::allocator<char>>&),char*&,int,int&,std::reference_wrapper<std::vector<char,std::allocator<char>>>>
              ((vector<std::thread,std::allocator<std::thread>> *)local_80,JudgePart,
               (char **)&res.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
               &local_88,
               (int *)((long)&thread_vec.
                              super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4),
               &stack0xffffffffffffff70);
  }
  end_time._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::size
                      ((vector<std::thread,_std::allocator<std::thread>_> *)local_80);
    if (sVar2 <= (ulong)(long)end_time._4_4_) break;
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_80,(long)end_time._4_4_);
    std::thread::join();
    end_time._4_4_ = end_time._4_4_ + 1;
  }
  cVar3 = clock();
  printf(anon_var_dwarf_8817,(double)(cVar3 - cVar1) / 1000000.0);
  StorePredict((vector<char,_std::allocator<char>_> *)local_48,predict_file);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_80);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_48)
  ;
  return;
}

Assistant:

void Predict (const string & test_file, const string & predict_file) {
#ifdef TEST
    clock_t start_time = clock();
#endif

    int fd = open(test_file.c_str(), O_RDONLY);
    char * buf = (char *) mmap(NULL, 120000000, PROT_READ, MAP_PRIVATE, fd, 0);
    madvise(buf, 120000000, MADV_SEQUENTIAL);
    close(fd);

    vector<char> res(20000, '1');

    int thread_num = 8;
    int cnt_per_thread = 20000 / thread_num;
    vector<thread> thread_vec;
    for (int i = 0; i < thread_num; i++) {
        thread_vec.emplace_back(JudgePart, buf, i * cnt_per_thread, cnt_per_thread, ref(res));
    }

    for (int i = 0; i < thread_vec.size(); i++) {
        thread_vec[i].join();
    }

#ifdef TEST
    clock_t end_time = clock();
    printf("预测耗时（s）: %f \n", (double) (end_time - start_time) / CLOCKS_PER_SEC);
#endif

    StorePredict(res, predict_file);
}